

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

optional<n_e_s::core::Pixel> __thiscall n_e_s::core::Ppu::execute(Ppu *this)

{
  ushort uVar1;
  optional<n_e_s::core::Pixel> oVar2;
  ulong unaff_R14;
  ulong uVar3;
  
  uVar1 = this->registers_->scanline;
  if (uVar1 == 0x105) {
    execute_pre_render_scanline(this);
  }
  else {
    if (uVar1 < 0xf0) {
      fetch(this);
      increase_scroll_counters(this);
      oVar2 = pixel(this);
      unaff_R14 = (ulong)(uint6)oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>.
                                _M_payload.super__Optional_payload_base<n_e_s::core::Pixel>;
      uVar3 = (ulong)((uint6)oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                             super__Optional_payload_base<n_e_s::core::Pixel> >> 0x28);
      goto LAB_001179c2;
    }
    if ((ushort)(uVar1 - 0xf1) < 0x14) {
      execute_vblank_scanline(this);
    }
  }
  uVar3 = 0;
LAB_001179c2:
  update_counters(this);
  return (_Optional_base<n_e_s::core::Pixel,_true,_true>)
         ((uint6)unaff_R14 & 0xffffffffff | (uint6)(uVar3 << 0x28));
}

Assistant:

std::optional<Pixel> Ppu::execute() {
    std::optional<Pixel> pixel;

    if (is_pre_render_scanline()) {
        execute_pre_render_scanline();
    } else if (is_visible_scanline()) {
        pixel = execute_visible_scanline();
    } else if (is_post_render_scanline()) {
        execute_post_render_scanline();
    } else if (is_vblank_scanline()) {
        execute_vblank_scanline();
    }

    update_counters();
    return pixel;
}